

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O0

int pt_pkt_get_sync_offset(pt_packet_decoder *decoder,uint64_t *offset)

{
  uint8_t *sync;
  uint8_t *begin;
  uint64_t *offset_local;
  pt_packet_decoder *decoder_local;
  
  if ((decoder == (pt_packet_decoder *)0x0) || (offset == (uint64_t *)0x0)) {
    decoder_local._4_4_ = -2;
  }
  else if (decoder->sync == (uint8_t *)0x0) {
    decoder_local._4_4_ = -3;
  }
  else {
    *offset = (long)decoder->sync - (long)(decoder->config).begin;
    decoder_local._4_4_ = 0;
  }
  return decoder_local._4_4_;
}

Assistant:

int pt_pkt_get_sync_offset(const struct pt_packet_decoder *decoder,
			   uint64_t *offset)
{
	const uint8_t *begin, *sync;

	if (!decoder || !offset)
		return -pte_invalid;

	begin = decoder->config.begin;
	sync = decoder->sync;

	if (!sync)
		return -pte_nosync;

	*offset = (uint64_t) (int64_t) (sync - begin);
	return 0;
}